

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O3

_Bool X86_lockrep(MCInst *MI,SStream *O)

{
  uint8_t uVar1;
  ushort uVar2;
  unsigned_short uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  _Bool _Var7;
  char *pcVar8;
  
  uVar1 = MI->x86_prefix[0];
  if (uVar1 == 0xf3) {
    uVar4 = MCInst_getOpcode(MI);
    uVar3 = insn_find(insns,0x1726,uVar4,&MI->csh->insn_cache);
    if (uVar3 == 0) goto switchD_001a3c05_caseD_1d1;
    uVar2 = insns[uVar3].mapid;
    if (uVar2 < 0x1cf) {
      if (uVar2 < 0x149) {
        if (((4 < uVar2 - 0xd9) || ((0x19U >> (uVar2 - 0xd9 & 0x1f) & 1) == 0)) && (uVar2 != 0x148))
        goto switchD_001a3c05_caseD_1d1;
      }
      else if ((1 < uVar2 - 0x14a) && ((uVar2 != 0x149 || (uVar4 != 0x517))))
      goto switchD_001a3c05_caseD_1d1;
    }
    else if (uVar2 < 0x1ea) {
      switch(uVar2) {
      case 0x1cf:
      case 0x1d3:
      case 0x1d5:
        break;
      case 0x1d0:
        if (uVar4 != 0x6ae) goto switchD_001a3c05_caseD_1d1;
        break;
      default:
switchD_001a3c05_caseD_1d1:
        uVar3 = insn_find(insns,0x1726,uVar4,&MI->csh->insn_cache);
        if (uVar3 == 0) goto switchD_001a3cbf_caseD_63;
        uVar2 = insns[uVar3].mapid;
        if (0x265 < uVar2) {
          if (((1 < uVar2 - 0x268) && (uVar2 != 0x266)) && ((uVar2 != 0x267 || (uVar4 != 0x9f2))))
          goto switchD_001a3cbf_caseD_63;
          goto switchD_001a3cbf_caseD_60;
        }
        switch(uVar2) {
        case 0x61:
          if (uVar4 != 0x233) goto switchD_001a3cbf_caseD_63;
        case 0x60:
        case 0x62:
        case 100:
switchD_001a3cbf_caseD_60:
          pcVar8 = "repe|";
          break;
        default:
switchD_001a3cbf_caseD_63:
          MI->x86_prefix[0] = '\0';
          if (uVar4 != 0x6e9) goto LAB_001a3d6c;
          MCInst_setOpcode(MI,0x6f2);
          pcVar8 = "mulss\t";
          goto LAB_001a3d5d;
        }
        goto LAB_001a3cf3;
      }
    }
    else if (uVar2 < 0x29c) {
      if ((2 < uVar2 - 0x1ea) && (uVar2 != 0x29b)) goto switchD_001a3c05_caseD_1d1;
    }
    else if ((1 < uVar2 - 0x29d) && ((uVar2 != 0x29c || (uVar4 != 0xab1))))
    goto switchD_001a3c05_caseD_1d1;
    pcVar8 = "rep|";
  }
  else {
    if (uVar1 != 0xf2) {
      if (uVar1 == 0xf0) {
        _Var7 = false;
        SStream_concat(O,"lock|");
        goto LAB_001a3d6e;
      }
LAB_001a3d6c:
      _Var7 = false;
      goto LAB_001a3d6e;
    }
    uVar4 = MCInst_getOpcode(MI);
    uVar3 = insn_find(insns,0x1726,uVar4,&MI->csh->insn_cache);
    if (uVar3 == 0) goto switchD_001a3c52_caseD_63;
    uVar2 = insns[uVar3].mapid;
    if (uVar2 < 0x1cf) {
      switch(uVar2) {
      case 0x60:
      case 0x62:
      case 100:
        break;
      case 0x61:
        if (uVar4 != 0x233) goto switchD_001a3c52_caseD_63;
        break;
      case 99:
switchD_001a3c52_caseD_63:
        MI->x86_prefix[0] = '\0';
        if (uVar4 == 0x6e9) {
          MCInst_setOpcode(MI,0x6ee);
          pcVar8 = "mulsd\t";
LAB_001a3d5d:
          SStream_concat(O,pcVar8);
          _Var7 = true;
          goto LAB_001a3d6e;
        }
        goto LAB_001a3d6c;
      default:
        if (3 < uVar2 - 0x148) {
          uVar5 = uVar2 - 0xd9;
          if (uVar5 < 5) {
            uVar6 = 0x19;
            goto LAB_001a3be3;
          }
          goto switchD_001a3c52_caseD_63;
        }
      }
    }
    else {
      uVar5 = uVar2 - 0x266;
      if (0x38 < uVar5) {
LAB_001a3bd0:
        uVar5 = uVar2 - 0x1cf;
        if (uVar5 < 0x1e) {
          uVar6 = 0x38000053;
LAB_001a3be3:
          if ((uVar6 >> (uVar5 & 0x1f) & 1) != 0) goto switchD_001a3c52_caseD_60;
        }
        goto switchD_001a3c52_caseD_63;
      }
      if ((0x1e000000000000dU >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
        if ((ulong)uVar5 != 1) goto LAB_001a3bd0;
        if (uVar4 != 0x9f2) goto switchD_001a3c52_caseD_63;
      }
    }
switchD_001a3c52_caseD_60:
    pcVar8 = "repne|";
  }
LAB_001a3cf3:
  _Var7 = false;
  SStream_concat(O,pcVar8);
  add_cx(MI);
LAB_001a3d6e:
  if (MI->csh->detail != CS_OPT_OFF) {
    *(undefined4 *)(MI->flat_insn->detail->field_6).x86.prefix = *(undefined4 *)MI->x86_prefix;
  }
  return _Var7;
}

Assistant:

bool X86_lockrep(MCInst *MI, SStream *O)
{
	unsigned int opcode;
	bool res = false;

	switch(MI->x86_prefix[0]) {
		default:
			break;
		case 0xf0:
#ifndef CAPSTONE_DIET
			SStream_concat(O, "lock|");
#endif
			break;
		case 0xf2:	// repne
			opcode = MCInst_getOpcode(MI);
#ifndef CAPSTONE_DIET	// only care about memonic in standard (non-diet) mode
			if (valid_repne(MI->csh, opcode)) {
				SStream_concat(O, "repne|");
				add_cx(MI);
			} else {
				// invalid prefix
				MI->x86_prefix[0] = 0;

				// handle special cases
#ifndef CAPSTONE_X86_REDUCE
				if (opcode == X86_MULPDrr) {
					MCInst_setOpcode(MI, X86_MULSDrr);
					SStream_concat(O, "mulsd\t");
					res = true;
				}
#endif
			}
#else	// diet mode -> only patch opcode in special cases
			if (!valid_repne(MI->csh, opcode)) {
				MI->x86_prefix[0] = 0;
			}
#ifndef CAPSTONE_X86_REDUCE
			// handle special cases
			if (opcode == X86_MULPDrr) {
				MCInst_setOpcode(MI, X86_MULSDrr);
			}
#endif
#endif
			break;

		case 0xf3:
			opcode = MCInst_getOpcode(MI);
#ifndef CAPSTONE_DIET	// only care about memonic in standard (non-diet) mode
			if (valid_rep(MI->csh, opcode)) {
				SStream_concat(O, "rep|");
				add_cx(MI);
			} else if (valid_repe(MI->csh, opcode)) {
				SStream_concat(O, "repe|");
				add_cx(MI);
			} else {
				// invalid prefix
				MI->x86_prefix[0] = 0;

				// handle special cases
#ifndef CAPSTONE_X86_REDUCE
				if (opcode == X86_MULPDrr) {
					MCInst_setOpcode(MI, X86_MULSSrr);
					SStream_concat(O, "mulss\t");
					res = true;
				}
#endif
			}
#else	// diet mode -> only patch opcode in special cases
			if (!valid_rep(MI->csh, opcode) && !valid_repe(MI->csh, opcode)) {
				MI->x86_prefix[0] = 0;
			}
#ifndef CAPSTONE_X86_REDUCE
			// handle special cases
			if (opcode == X86_MULPDrr) {
				MCInst_setOpcode(MI, X86_MULSSrr);
			}
#endif
#endif
			break;
	}

	// copy normalized prefix[] back to x86.prefix[]
	if (MI->csh->detail)
		memcpy(MI->flat_insn->detail->x86.prefix, MI->x86_prefix, ARR_SIZE(MI->x86_prefix));

	return res;
}